

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void MOJOSHADER_glDeleteEffect(MOJOSHADER_glEffect *glEffect)

{
  int *piVar1;
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  MOJOSHADER_glShader *pMVar3;
  ulong uVar4;
  long lVar5;
  
  UNRECOVERED_JUMPTABLE = glEffect->effect->free;
  pvVar2 = glEffect->effect->malloc_data;
  if (glEffect->num_shaders != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pMVar3 = glEffect->shaders;
      piVar1 = (int *)((long)&pMVar3->refcount + lVar5);
      *piVar1 = *piVar1 + 1;
      MOJOSHADER_glDeleteShader((MOJOSHADER_glShader *)((long)&pMVar3->parseData + lVar5));
      (*ctx->profileDeleteShader)(*(GLuint *)((long)&glEffect->shaders->handle + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < glEffect->num_shaders);
  }
  (*UNRECOVERED_JUMPTABLE)(glEffect->shader_indices,pvVar2);
  (*UNRECOVERED_JUMPTABLE)(glEffect->preshader_indices,pvVar2);
  (*UNRECOVERED_JUMPTABLE)(glEffect,pvVar2);
  return;
}

Assistant:

void MOJOSHADER_glDeleteEffect(MOJOSHADER_glEffect *glEffect)
{
    int i;
    MOJOSHADER_free f = glEffect->effect->free;
    void *d = glEffect->effect->malloc_data;

    for (i = 0; i < glEffect->num_shaders; i++)
    {
        /* Arbitarily add a reference to the refcount.
         * We're going to be calling glDeleteShader so we can clean out the
         * program cache, but we can NOT let it free() the array elements!
         * We'll do that ourselves, as we malloc()'d in CompileEffect.
         * -flibit
         */
        glEffect->shaders[i].refcount++;
        MOJOSHADER_glDeleteShader(&glEffect->shaders[i]);

        /* Delete the shader, but do NOT delete the parse data!
         * The parse data belongs to the parent effect.
         * -flibit
         */
        ctx->profileDeleteShader(glEffect->shaders[i].handle);
    } // for

    f(glEffect->shader_indices, d);
    f(glEffect->preshader_indices, d);
    f(glEffect, d);
}